

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O3

void __thiscall Imf_3_4::OStream::~OStream(OStream *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

OStream::~OStream ()
{
    // empty
}